

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_getshortstr(Table *t,TString *key)

{
  int *piVar1;
  Node *pNVar2;
  
  pNVar2 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash);
  while (((pNVar2->u).key_tt != 'D' || ((TString *)(pNVar2->u).key_val.gc != key))) {
    piVar1 = &(pNVar2->u).next;
    pNVar2 = pNVar2 + *piVar1;
    if ((long)*piVar1 == 0) {
      return &absentkey;
    }
  }
  return (TValue *)pNVar2;
}

Assistant:

const TValue *luaH_getshortstr (Table *t, TString *key) {
  Node *n = hashstr(t, key);
  lua_assert(key->tt == LUA_VSHRSTR);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (keyisshrstr(n) && eqshrstr(keystrval(n), key))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return &absentkey;  /* not found */
      n += nx;
    }
  }
}